

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O3

void reportLine(ostream *os,bool ret,string *line,bool eol)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  if ((int)os != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,*(char **)CONCAT71(in_register_00000031,ret),
                        ((undefined8 *)CONCAT71(in_register_00000031,ret))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" (",3);
    pcVar2 = "without EOL";
    if ((byte)line != 0) {
      pcVar2 = "with EOL";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,pcVar2,(ulong)(byte)((byte)line ^ 1) * 3 + 8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"EOF",3);
  return;
}

Assistant:

static void reportLine(std::ostream& os, bool ret, std::string const& line,
                       bool eol)
{
  if (ret) {
    os << "\"" << line << "\" (" << (eol ? "with EOL" : "without EOL") << ")";
  } else {
    os << "EOF";
  }
}